

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_file.c
# Opt level: O1

int p2sc_create_file(int nuke,char *name,void *buf,size_t nbyte)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  undefined8 uVar5;
  char *fmt;
  
  iVar1 = open(name,(uint)(nuke == 0) << 7 | 0x241,0x1a4);
  if (iVar1 == -1) {
    piVar4 = __errno_location();
    if (*piVar4 == 0x11) {
      return -1;
    }
    uVar5 = g_strerror();
    fmt = "open(%s): %s";
    iVar1 = 0x156;
  }
  else {
    sVar3 = write(iVar1,buf,nbyte);
    if (((sVar3 != -1) && (iVar2 = fsync(iVar1), iVar2 != -1)) &&
       (iVar1 = close(iVar1), iVar1 != -1)) {
      return 0;
    }
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    unlink(name);
    uVar5 = g_strerror(iVar1);
    fmt = "%s: %s";
    iVar1 = 0x15d;
  }
  _p2sc_msg("p2sc_create_file",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
            ,iVar1,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",0x1068,fmt,name,uVar5);
  exit(1);
}

Assistant:

int p2sc_create_file(int nuke, const char *name, const void *buf, size_t nbyte) {
    int fd, flags = O_CREAT | O_TRUNC | O_WRONLY;

    if (!nuke)
        flags |= O_EXCL;

    fd = open(name, flags, S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH);
    if (fd == -1) {
        if (errno == EEXIST)
            return -1;
        else
            P2SC_Msg(LVL_FATAL_FILESYSTEM, "open(%s): %s", name, g_strerror(errno));
    }

    if (write(fd, buf, nbyte) == -1 || fsync(fd) == -1 || close(fd) == -1) {
        int e = errno;

        unlink(name);
        P2SC_Msg(LVL_FATAL_FILESYSTEM, "%s: %s", name, g_strerror(e));
    }

    return 0;
}